

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

bool cmQtAutoGen::RccListParseOutput
               (string *rccStdOut,string *rccStdErr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,string *error)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  string *psVar6;
  string oline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream ostr;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ostr,(string *)rccStdOut,_S_in);
  oline._M_string_length = 0;
  oline.field_2._M_local_buf[0] = '\0';
  oline._M_dataplus._M_p = (pointer)&oline.field_2;
  while( true ) {
    psVar6 = &oline;
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ostr,(string *)&oline);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    RccListParseOutput::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&oline,psVar6);
    if (oline._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(files,&oline);
    }
  }
  std::__cxx11::string::~string((string *)&oline);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
  std::__cxx11::istringstream::istringstream((istringstream *)&ostr,(string *)rccStdErr,_S_in);
  oline._M_string_length = 0;
  oline.field_2._M_local_buf[0] = '\0';
  oline._M_dataplus._M_p = (pointer)&oline.field_2;
  do {
    do {
      psVar6 = &oline;
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ostr,(string *)&oline);
      uVar1 = *(uint *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) {
LAB_002e843e:
        std::__cxx11::string::~string((string *)&oline);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
        return (uVar1 & 5) != 0;
      }
      RccListParseOutput::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&oline,psVar6);
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,14ul>(&oline,(char (*) [14])"RCC: Error in");
    } while (!bVar2);
    if (RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
        ::searchString_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                   ::searchString_abi_cxx11_);
      if (iVar3 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                    ::searchString_abi_cxx11_,"Cannot find file \'",(allocator<char> *)&local_1d0);
        __cxa_atexit(std::__cxx11::string::~string,
                     &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                      ::searchString_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                             ::searchString_abi_cxx11_);
      }
    }
    lVar5 = std::__cxx11::string::find((string *)&oline,0x58fe58);
    if (lVar5 == -1) {
      std::__cxx11::string::assign((char *)error);
      Quoted(&local_1d0,&oline);
      std::__cxx11::string::append((string *)error);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::append((char *)error);
      goto LAB_002e843e;
    }
    std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&oline);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_1d0
              );
    std::__cxx11::string::~string((string *)&local_1d0);
  } while( true );
}

Assistant:

bool cmQtAutoGen::RccListParseOutput(std::string const& rccStdOut,
                                     std::string const& rccStdErr,
                                     std::vector<std::string>& files,
                                     std::string& error)
{
  // Lambda to strip CR characters
  auto StripCR = [](std::string& line) {
    std::string::size_type cr = line.find('\r');
    if (cr != std::string::npos) {
      line = line.substr(0, cr);
    }
  };

  // Parse rcc std output
  {
    std::istringstream ostr(rccStdOut);
    std::string oline;
    while (std::getline(ostr, oline)) {
      StripCR(oline);
      if (!oline.empty()) {
        files.push_back(oline);
      }
    }
  }
  // Parse rcc error output
  {
    std::istringstream estr(rccStdErr);
    std::string eline;
    while (std::getline(estr, eline)) {
      StripCR(eline);
      if (cmHasLiteralPrefix(eline, "RCC: Error in")) {
        static std::string const searchString = "Cannot find file '";

        std::string::size_type pos = eline.find(searchString);
        if (pos == std::string::npos) {
          error = "rcc lists unparsable output:\n";
          error += cmQtAutoGen::Quoted(eline);
          error += "\n";
          return false;
        }
        pos += searchString.length();
        std::string::size_type sz = eline.size() - pos - 1;
        files.push_back(eline.substr(pos, sz));
      }
    }
  }

  return true;
}